

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int xml_root_init(parser_info *info,char **attr)

{
  coda_format format;
  node_info *pnVar1;
  int iVar2;
  coda_type_record *pcVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  char *__s1;
  
  if (info->product_definition == (coda_product_definition *)0x0) {
    __assert_fail("info->product_definition != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                  ,0x4a5,"int xml_root_init(parser_info *, const char **)");
  }
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar4 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    format = pnVar1->format;
    if (format == coda_format_xml) {
      pcVar6 = *attr;
      if (pcVar6 != (char *)0x0) {
        ppcVar5 = attr + 2;
        __s1 = pcVar6;
        do {
          iVar2 = strcmp(__s1,"name");
          if (iVar2 == 0) {
            if (ppcVar5[-1] != (char *)0x0) {
              pcVar6 = "attribute \'name\' not allowed for xml root record";
              goto LAB_001565a3;
            }
            break;
          }
          __s1 = *ppcVar5;
          ppcVar5 = ppcVar5 + 2;
        } while (__s1 != (char *)0x0);
        ppcVar5 = attr + 2;
        do {
          iVar2 = strcmp(pcVar6,"namexml");
          if (iVar2 == 0) {
            if (ppcVar5[-1] != (char *)0x0) {
              pcVar6 = "attribute \'namexml\' not allowed for xml root record";
LAB_001565a3:
              coda_set_error(-400,pcVar6);
              return -1;
            }
            break;
          }
          pcVar6 = *ppcVar5;
          ppcVar5 = ppcVar5 + 2;
        } while (pcVar6 != (char *)0x0);
      }
      pnVar1->free_data = coda_type_release;
      pcVar3 = coda_type_record_new(coda_format_xml);
      info->node->data = pcVar3;
      iVar2 = handle_name_attribute_for_type(info,attr);
      if (iVar2 == 0) {
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xe] = cd_field_init;
        pnVar1->add_element_to_parent[0xe] = xml_root_set_field;
        iVar4 = 0;
      }
    }
    else {
      pcVar6 = coda_type_get_format_name(format);
      coda_set_error(-400,"%s record not allowed for xml product definition %s",pcVar6,
                     info->product_definition->name);
    }
  }
  return iVar4;
}

Assistant:

static int xml_root_init(parser_info *info, const char **attr)
{
    const char *name = NULL;

    assert(info->product_definition != NULL);
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    if (info->node->format != coda_format_xml)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "%s record not allowed for xml product definition %s",
                       coda_type_get_format_name(info->node->format), info->product_definition->name);
        return -1;
    }
    name = get_attribute_value(attr, "name");
    if (name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'name' not allowed for xml root record");
        return -1;
    }
    name = get_attribute_value(attr, "namexml");
    if (name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'namexml' not allowed for xml root record");
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_record_new(coda_format_xml);

    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_field, cd_field_init, xml_root_set_field);

    return 0;
}